

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateStaticVariables
          (ImmutableMessageLiteGenerator *this,Printer *printer,int *bytecode_estimate)

{
  int iVar1;
  int iVar2;
  Descriptor *descriptor;
  ImmutableMessageLiteGenerator local_98;
  int local_24;
  int *piStack_20;
  int i;
  int *bytecode_estimate_local;
  Printer *printer_local;
  ImmutableMessageLiteGenerator *this_local;
  
  local_24 = 0;
  piStack_20 = bytecode_estimate;
  bytecode_estimate_local = (int *)printer;
  printer_local = (Printer *)this;
  while( true ) {
    iVar1 = local_24;
    iVar2 = Descriptor::nested_type_count((this->super_MessageGenerator).descriptor_);
    if (iVar2 <= iVar1) break;
    descriptor = Descriptor::nested_type((this->super_MessageGenerator).descriptor_,local_24);
    ImmutableMessageLiteGenerator(&local_98,descriptor,this->context_);
    GenerateStaticVariables(&local_98,(Printer *)bytecode_estimate_local,piStack_20);
    ~ImmutableMessageLiteGenerator(&local_98);
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateStaticVariables(
    io::Printer* printer, int* bytecode_estimate) {
  // Generate static members for all nested types.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // TODO(kenton):  Reuse MessageGenerator objects?
    ImmutableMessageLiteGenerator(descriptor_->nested_type(i), context_)
        .GenerateStaticVariables(printer, bytecode_estimate);
  }
}